

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

void testing::InitGoogleMock(void)

{
  int argc;
  char *argv0;
  int local_c;
  char *local_8;
  
  local_c = 1;
  local_8 = "dummy";
  internal::InitGoogleMockImpl<char>(&local_c,&local_8);
  return;
}

Assistant:

GTEST_API_ void InitGoogleMock() {
  // Since Arduino doesn't have a command line, fake out the argc/argv arguments
  int argc = 1;
  const auto arg0 = "dummy";
  char* argv0 = const_cast<char*>(arg0);
  char** argv = &argv0;

  internal::InitGoogleMockImpl(&argc, argv);
}